

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

ScanResult * __thiscall
wallet::CWallet::ScanForWalletTransactions
          (CWallet *this,uint256 *start_block,int start_height,optional<int> max_height,
          WalletRescanReserver *reserver,bool fUpdate,bool save_progress)

{
  double dVar1;
  ConstevalFormatString<2U> wallet_fmt;
  ConstevalFormatString<2U> wallet_fmt_00;
  ConstevalFormatString<1U> wallet_fmt_01;
  ConstevalFormatString<2U> wallet_fmt_02;
  ConstevalFormatString<2U> wallet_fmt_03;
  ConstevalFormatString<1U> wallet_fmt_04;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar2;
  bool bVar3;
  strong_ordering sVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint *puVar9;
  Chain *pCVar10;
  bool *pbVar11;
  FoundBlock *pFVar12;
  size_type sVar13;
  int *piVar14;
  ConstevalStringLiteral str;
  int in_ECX;
  undefined8 *in_RDX;
  long in_RSI;
  ScanResult *in_RDI;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  byte in_stack_00000010;
  size_t posInBlock;
  bool fetch_block;
  bool next_interval;
  double progress_end;
  double progress_begin;
  WalletBatch batch;
  CBlockLocator loc;
  bool next_block;
  bool block_still_active;
  optional<bool> matches_block;
  int block_height;
  double progress_current;
  unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  fast_rescan_filter;
  time_point start_time;
  time_point current_time;
  seconds INTERVAL_TIME;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  uint256 prev_tip_hash;
  CBlock block;
  uint256 next_block_hash;
  uint256 end_hash;
  uint256 tip_hash;
  uint256 block_hash;
  int in_stack_fffffffffffff6e8;
  int in_stack_fffffffffffff6ec;
  char *in_stack_fffffffffffff6f0;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_fffffffffffff6f8;
  FastWalletRescanFilter *in_stack_fffffffffffff700;
  undefined4 in_stack_fffffffffffff708;
  int in_stack_fffffffffffff70c;
  CWallet *in_stack_fffffffffffff710;
  string *in_stack_fffffffffffff718;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffff720;
  undefined7 in_stack_fffffffffffff728;
  undefined1 in_stack_fffffffffffff72f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff730;
  ConstevalStringLiteral in_stack_fffffffffffff738;
  undefined7 in_stack_fffffffffffff750;
  undefined1 in_stack_fffffffffffff757;
  ConstevalFormatString<0U> in_stack_fffffffffffff758;
  undefined4 in_stack_fffffffffffff768;
  int in_stack_fffffffffffff76c;
  ConstevalFormatString<2U> in_stack_fffffffffffff798;
  undefined7 in_stack_fffffffffffff7a0;
  undefined1 in_stack_fffffffffffff7a7;
  char *in_stack_fffffffffffff7a8;
  FoundBlock *in_stack_fffffffffffff7b0;
  Chain *in_stack_fffffffffffff7b8;
  byte local_7b1;
  Chain *in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8a8;
  undefined4 uVar15;
  int iVar16;
  ulong local_6f0;
  int local_6e4;
  double local_6b0;
  undefined1 local_628 [30];
  byte local_60a;
  byte local_609;
  _Optional_payload_base<bool> local_5c2;
  duration local_5c0;
  duration local_5b0;
  duration local_5a8;
  int local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  undefined1 local_594 [52];
  duration local_560;
  undefined8 local_558;
  _Optional_payload_base<int> local_550;
  char local_538 [128];
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  uchar local_4a8 [104];
  _Optional_payload_base<int> local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined4 local_320;
  _Rb_tree_color _Stack_31c;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined4 uStack_300;
  _Rb_tree_color _Stack_2fc;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_208 [224];
  undefined8 local_128 [4];
  undefined8 local_108 [28];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_558 = 0x3c;
  iVar16 = in_ECX;
  local_560.__r = (rep)WalletRescanReserver::now((WalletRescanReserver *)in_stack_fffffffffffff6f0);
  local_594._44_8_ = WalletRescanReserver::now((WalletRescanReserver *)in_stack_fffffffffffff6f0);
  bVar3 = WalletRescanReserver::isReserved((WalletRescanReserver *)in_stack_fffffffffffff6f8.__r);
  if (!bVar3) {
    __assert_fail("reserver.isReserved()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                  ,0x75a,
                  "CWallet::ScanResult wallet::CWallet::ScanForWalletTransactions(const uint256 &, int, std::optional<int>, const WalletRescanReserver &, bool, const bool)"
                 );
  }
  local_28 = *in_RDX;
  uStack_20 = in_RDX[1];
  local_18 = in_RDX[2];
  uStack_10 = in_RDX[3];
  ScanResult::ScanResult
            ((ScanResult *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  std::
  unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>>
  ::unique_ptr<std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>,void>
            ((unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
              *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  bVar3 = IsLegacy((CWallet *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  uVar15 = CONCAT13(bVar3,(int3)in_stack_fffffffffffff8a8);
  if (!bVar3) {
    in_stack_fffffffffffff8a0 = chain((CWallet *)in_stack_fffffffffffff6f8.__r);
    uVar6 = (*in_stack_fffffffffffff8a0->_vptr_Chain[8])(in_stack_fffffffffffff8a0,0);
    if ((uVar6 & 1) != 0) {
      std::make_unique<wallet::(anonymous_namespace)::FastWalletRescanFilter,wallet::CWallet&>
                (in_stack_fffffffffffff710);
      std::
      unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      ::operator=((unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                   *)in_stack_fffffffffffff6f8.__r,
                  (unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                   *)in_stack_fffffffffffff6f0);
      std::
      unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      ::~unique_ptr((unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                     *)in_stack_fffffffffffff6f8.__r);
    }
  }
  base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff6f0);
  bVar3 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                      *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  local_594._20_8_ = "slow variant inspecting all blocks";
  if (bVar3) {
    local_594._20_8_ = "fast variant using block filters";
  }
  wallet_fmt.fmt._4_4_ = in_stack_fffffffffffff76c;
  wallet_fmt.fmt._0_4_ = in_stack_fffffffffffff768;
  WalletLogPrintf<std::__cxx11::string,char_const*>
            ((CWallet *)in_stack_fffffffffffff738.lit,wallet_fmt,in_stack_fffffffffffff730,
             (char **)CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  std::atomic<bool>::operator=
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),false);
  lVar8 = in_RSI + 0x448;
  ::_(in_stack_fffffffffffff738);
  std::operator+((char *)in_stack_fffffffffffff700,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff6f8.__r);
  GetDisplayName_abi_cxx11_
            ((CWallet *)CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728));
  tinyformat::format<std::__cxx11::string>
            (in_stack_fffffffffffff718,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff710);
  boost::signals2::
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
  ::operator()((signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
                *)in_stack_fffffffffffff6f8.__r,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  bilingual_str::~bilingual_str
            ((bilingual_str *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  ScanForWalletTransactions::anon_class_8_1_8991fb9c::operator()
            ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffff718);
  local_128[0] = local_108[0];
  local_128[1] = local_108[1];
  local_128[2] = local_108[2];
  local_128[3]._0_4_ = (undefined4)local_108[3];
  local_128[3]._4_4_ = local_108[3]._4_4_;
  bVar3 = std::optional::operator_cast_to_bool
                    ((optional<int> *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8))
  ;
  if (bVar3) {
    pCVar10 = chain((CWallet *)in_stack_fffffffffffff6f8.__r);
    puVar9 = (uint *)std::optional<int>::operator*
                               ((optional<int> *)
                                CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    uVar6 = *puVar9;
    local_3f8 = 0;
    uStack_3f0 = 0;
    local_408 = 0;
    uStack_400 = 0;
    local_418 = 0;
    uStack_410 = 0;
    local_428 = 0;
    uStack_420._0_4_ = 0;
    uStack_420._4_4_ = _S_red;
    local_438 = 0;
    uStack_430 = 0;
    interfaces::FoundBlock::FoundBlock
              ((FoundBlock *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    pFVar12 = interfaces::FoundBlock::hash
                        ((FoundBlock *)in_stack_fffffffffffff6f8.__r,
                         (uint256 *)in_stack_fffffffffffff6f0);
    (*pCVar10->_vptr_Chain[0xc])(pCVar10,local_108,(ulong)uVar6,pFVar12);
  }
  pCVar10 = chain((CWallet *)in_stack_fffffffffffff6f8.__r);
  (*pCVar10->_vptr_Chain[0x10])(pCVar10,&local_28);
  pCVar10 = chain((CWallet *)in_stack_fffffffffffff6f8.__r);
  (*pCVar10->_vptr_Chain[0x10])(pCVar10,local_128);
  local_6b0 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  local_594._0_4_ = in_ECX;
  while( true ) {
    bVar3 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff700);
    local_7b1 = 0;
    if (!bVar3) {
      pCVar10 = chain((CWallet *)in_stack_fffffffffffff6f8.__r);
      iVar7 = (*pCVar10->_vptr_Chain[0x24])();
      local_7b1 = (byte)iVar7 ^ 0xff;
    }
    if ((local_7b1 & 1) == 0) break;
    if (local_6b0 - (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) <= 0.0) {
      std::__atomic_float<double>::operator=
                ((__atomic_float<double> *)in_stack_fffffffffffff6f8.__r,
                 (double)in_stack_fffffffffffff6f0);
    }
    else {
      std::__atomic_float<double>::operator=
                ((__atomic_float<double> *)in_stack_fffffffffffff6f8.__r,
                 (double)in_stack_fffffffffffff6f0);
    }
    if (((int)local_594._0_4_ % 100 == 0) &&
       (0.0 < local_6b0 - (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da))) {
      ::_(in_stack_fffffffffffff738);
      std::operator+((char *)in_stack_fffffffffffff700,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff6f8.__r);
      GetDisplayName_abi_cxx11_
                ((CWallet *)CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728));
      tinyformat::format<std::__cxx11::string>
                (in_stack_fffffffffffff718,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff710);
      local_598 = 1;
      local_59c = 99;
      dVar1 = std::__atomic_float::operator_cast_to_double
                        ((__atomic_float<double> *)
                         CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      local_5a0 = (int)(dVar1 * 100.0);
      std::min<int>((int *)in_stack_fffffffffffff6f0,
                    (int *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      std::max<int>((int *)in_stack_fffffffffffff6f0,
                    (int *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      boost::signals2::
      signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
      ::operator()((signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
                    *)in_stack_fffffffffffff6f8.__r,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    }
    local_5a8.__r =
         (rep)WalletRescanReserver::now((WalletRescanReserver *)in_stack_fffffffffffff6f0);
    local_5b0.__r =
         (rep)std::chrono::operator+
                        ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)in_stack_fffffffffffff6f0,
                         (duration<long,_std::ratio<1L,_1L>_> *)
                         CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    sVar4 = std::chrono::
            operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffff6f0,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    std::__cmp_cat::__unspec::__unspec
              ((__unspec *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
               (__unspec *)0x170799a);
    bVar3 = std::operator>=(sVar4._M_value);
    if (bVar3) {
      local_5c0.__r =
           (rep)WalletRescanReserver::now((WalletRescanReserver *)in_stack_fffffffffffff6f0);
      wallet_fmt_00.fmt._4_4_ = in_stack_fffffffffffff76c;
      wallet_fmt_00.fmt._0_4_ = in_stack_fffffffffffff768;
      local_560.__r = local_5c0.__r;
      WalletLogPrintf<int,double>
                ((CWallet *)in_stack_fffffffffffff738.lit,wallet_fmt_00,
                 (int *)in_stack_fffffffffffff730,
                 (double *)CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728));
    }
    bVar2 = true;
    bVar5 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                        *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    if (bVar5) {
      std::
      unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      ::operator->((unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                    *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      anon_unknown_48::FastWalletRescanFilter::UpdateIfNeeded
                ((FastWalletRescanFilter *)in_stack_fffffffffffff738.lit);
      std::
      unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
      ::operator->((unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                    *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      local_5c2 = (_Optional_payload_base<bool>)
                  anon_unknown_48::FastWalletRescanFilter::MatchesBlock
                            (in_stack_fffffffffffff700,(uint256 *)in_stack_fffffffffffff6f8.__r);
      bVar5 = std::optional<bool>::has_value
                        ((optional<bool> *)
                         CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      if (bVar5) {
        pbVar11 = std::optional<bool>::operator*
                            ((optional<bool> *)
                             CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        if ((*pbVar11 & 1U) == 0) {
          *(undefined8 *)(in_RDI->last_scanned_block).super_base_blob<256U>.m_data._M_elems =
               local_28;
          *(undefined8 *)((in_RDI->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 8) =
               uStack_20;
          *(undefined8 *)((in_RDI->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 0x10)
               = local_18;
          *(undefined8 *)((in_RDI->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 0x18)
               = uStack_10;
          std::optional<int>::optional<int_&,_true>
                    ((optional<int> *)in_stack_fffffffffffff6f8.__r,(int *)in_stack_fffffffffffff6f0
                    );
          (in_RDI->last_scanned_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int> = local_440;
          bVar2 = false;
        }
        else {
          bVar5 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                                      Trace);
          if (bVar5) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
                       (char *)in_stack_fffffffffffff700);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
                       (char *)in_stack_fffffffffffff700);
            base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff6f0);
            in_stack_fffffffffffff700 = (FastWalletRescanFilter *)(local_208 + 0x20);
            in_stack_fffffffffffff6f8.__r = (rep)local_594;
            in_stack_fffffffffffff6f0 = "Fast rescan: inspect block %d [%s] (filter matched)\n";
            in_stack_fffffffffffff6e8 = 1;
            logging_function._M_str = (char *)in_stack_fffffffffffff7b8;
            logging_function._M_len = (size_t)in_stack_fffffffffffff7b0;
            source_file._M_len._7_1_ = in_stack_fffffffffffff7a7;
            source_file._M_len._0_7_ = in_stack_fffffffffffff7a0;
            source_file._M_str = in_stack_fffffffffffff7a8;
            LogPrintFormatInternal<int,std::__cxx11::string>
                      (logging_function,source_file,
                       (int)((ulong)in_stack_fffffffffffff758.fmt >> 0x20),
                       CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),(Level)lVar8,
                       in_stack_fffffffffffff798,(int *)in_stack_fffffffffffff8a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(iVar16,uVar15));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
          }
        }
      }
      else {
        bVar5 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                                    Trace);
        if (bVar5) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
                     (char *)in_stack_fffffffffffff700);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
                     (char *)in_stack_fffffffffffff700);
          base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff6f0);
          in_stack_fffffffffffff700 = (FastWalletRescanFilter *)local_208;
          in_stack_fffffffffffff6f8.__r = (rep)local_594;
          in_stack_fffffffffffff6f0 =
               "Fast rescan: inspect block %d [%s] (WARNING: block filter not found!)\n";
          in_stack_fffffffffffff6e8 = 1;
          logging_function_00._M_str = (char *)in_stack_fffffffffffff7b8;
          logging_function_00._M_len = (size_t)in_stack_fffffffffffff7b0;
          source_file_00._M_len._7_1_ = in_stack_fffffffffffff7a7;
          source_file_00._M_len._0_7_ = in_stack_fffffffffffff7a0;
          source_file_00._M_str = in_stack_fffffffffffff7a8;
          LogPrintFormatInternal<int,std::__cxx11::string>
                    (logging_function_00,source_file_00,
                     (int)((ulong)in_stack_fffffffffffff758.fmt >> 0x20),
                     CONCAT17(in_stack_fffffffffffff757,in_stack_fffffffffffff750),(Level)lVar8,
                     in_stack_fffffffffffff798,(int *)in_stack_fffffffffffff8a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar16,uVar15));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        }
      }
    }
    local_609 = 0;
    local_60a = 0;
    uint256::uint256((uint256 *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    pCVar10 = chain((CWallet *)in_stack_fffffffffffff6f8.__r);
    local_4a8._80_8_ = 0;
    local_4a8._88_8_ = 0;
    local_4a8._64_8_ = 0;
    local_4a8._72_8_ = 0;
    local_4a8._48_8_ = 0;
    local_4a8._56_8_ = 0;
    local_4a8[0x20] = 0;
    local_4a8[0x21] = 0;
    local_4a8[0x22] = 0;
    local_4a8[0x23] = 0;
    local_4a8[0x24] = 0;
    local_4a8[0x25] = 0;
    local_4a8[0x26] = 0;
    local_4a8[0x27] = 0;
    local_4a8._40_8_ = 0;
    local_4a8[0x10] = '\0';
    local_4a8[0x11] = '\0';
    local_4a8[0x12] = '\0';
    local_4a8[0x13] = '\0';
    local_4a8[0x14] = '\0';
    local_4a8[0x15] = '\0';
    local_4a8[0x16] = '\0';
    local_4a8[0x17] = '\0';
    local_4a8._24_8_ = 0;
    interfaces::FoundBlock::FoundBlock
              ((FoundBlock *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    interfaces::FoundBlock::inActiveChain
              ((FoundBlock *)in_stack_fffffffffffff6f8.__r,(bool *)in_stack_fffffffffffff6f0);
    local_4a8[0] = '\0';
    local_4a8[1] = '\0';
    local_4a8[2] = '\0';
    local_4a8[3] = '\0';
    local_4a8[4] = '\0';
    local_4a8[5] = '\0';
    local_4a8[6] = '\0';
    local_4a8[7] = '\0';
    local_4a8[8] = '\0';
    local_4a8[9] = '\0';
    local_4a8[10] = '\0';
    local_4a8[0xb] = '\0';
    local_4a8[0xc] = '\0';
    local_4a8[0xd] = '\0';
    local_4a8[0xe] = '\0';
    local_4a8[0xf] = '\0';
    local_4b8 = 0;
    uStack_4b0 = 0;
    local_538._112_8_ = 0;
    local_538[0x78] = '\0';
    local_538[0x79] = '\0';
    local_538[0x7a] = '\0';
    local_538[0x7b] = '\0';
    local_538[0x7c] = '\0';
    local_538[0x7d] = '\0';
    local_538[0x7e] = '\0';
    local_538[0x7f] = '\0';
    local_538._96_8_ = 0;
    local_538._104_8_ = 0;
    local_538._80_8_ = 0;
    local_538._88_8_ = 0;
    interfaces::FoundBlock::FoundBlock
              ((FoundBlock *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    interfaces::FoundBlock::inActiveChain
              ((FoundBlock *)in_stack_fffffffffffff6f8.__r,(bool *)in_stack_fffffffffffff6f0);
    interfaces::FoundBlock::hash
              ((FoundBlock *)in_stack_fffffffffffff6f8.__r,(uint256 *)in_stack_fffffffffffff6f0);
    pFVar12 = interfaces::FoundBlock::nextBlock
                        ((FoundBlock *)in_stack_fffffffffffff6f8.__r,
                         (FoundBlock *)in_stack_fffffffffffff6f0);
    (*pCVar10->_vptr_Chain[10])(pCVar10,&local_28,pFVar12);
    if (bVar2) {
      CBlock::CBlock((CBlock *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
      in_stack_fffffffffffff7b8 = chain((CWallet *)in_stack_fffffffffffff6f8.__r);
      local_538._64_8_ = 0;
      local_538._72_8_ = 0;
      local_538._48_8_ = 0;
      local_538._56_8_ = 0;
      local_538._32_8_ = 0;
      local_538._40_8_ = 0;
      local_538._16_8_ = 0;
      local_538._24_8_ = 0;
      local_538._0_8_ = 0;
      local_538._8_8_ = 0;
      in_stack_fffffffffffff7a8 = local_538;
      interfaces::FoundBlock::FoundBlock
                ((FoundBlock *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      in_stack_fffffffffffff7b0 =
           interfaces::FoundBlock::data
                     ((FoundBlock *)in_stack_fffffffffffff6f8.__r,
                      (CBlock *)in_stack_fffffffffffff6f0);
      (*in_stack_fffffffffffff7b8->_vptr_Chain[10])
                (in_stack_fffffffffffff7b8,&local_28,in_stack_fffffffffffff7b0);
      in_stack_fffffffffffff7a7 =
           CBlockHeader::IsNull
                     ((CBlockHeader *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8))
      ;
      if ((bool)in_stack_fffffffffffff7a7) {
        *(undefined8 *)(in_RDI->last_failed_block).super_base_blob<256U>.m_data._M_elems = local_28;
        *(undefined8 *)((in_RDI->last_failed_block).super_base_blob<256U>.m_data._M_elems + 8) =
             uStack_20;
        *(undefined8 *)((in_RDI->last_failed_block).super_base_blob<256U>.m_data._M_elems + 0x10) =
             local_18;
        *(undefined8 *)((in_RDI->last_failed_block).super_base_blob<256U>.m_data._M_elems + 0x18) =
             uStack_10;
        in_RDI->status = FAILURE;
LAB_01708382:
        local_6e4 = 0;
      }
      else {
        in_stack_fffffffffffff798.fmt =
             (char *)MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                               ((AnnotatedMixin<std::recursive_mutex> *)
                                CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                   CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),
                   in_stack_fffffffffffff720,(char *)in_stack_fffffffffffff718,
                   (char *)in_stack_fffffffffffff710,in_stack_fffffffffffff70c,
                   SUB41((uint)in_stack_fffffffffffff708 >> 0x18,0));
        if ((local_609 & 1) == 0) {
          *(undefined8 *)(in_RDI->last_failed_block).super_base_blob<256U>.m_data._M_elems =
               local_28;
          *(undefined8 *)((in_RDI->last_failed_block).super_base_blob<256U>.m_data._M_elems + 8) =
               uStack_20;
          *(undefined8 *)((in_RDI->last_failed_block).super_base_blob<256U>.m_data._M_elems + 0x10)
               = local_18;
          *(undefined8 *)((in_RDI->last_failed_block).super_base_blob<256U>.m_data._M_elems + 0x18)
               = uStack_10;
          in_RDI->status = FAILURE;
          local_6e4 = 3;
        }
        else {
          for (local_6f0 = 0;
              sVar13 = std::
                       vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)),
              local_6f0 < sVar13; local_6f0 = local_6f0 + 1) {
            std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          *)in_stack_fffffffffffff6f8.__r,(size_type)in_stack_fffffffffffff6f0);
            TxStateConfirmed::TxStateConfirmed
                      ((TxStateConfirmed *)in_stack_fffffffffffff6f8.__r,
                       (uint256 *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
                       in_stack_fffffffffffff6e8);
            std::variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateInactive>
            ::variant<wallet::TxStateConfirmed,void,void,wallet::TxStateConfirmed,void>
                      ((variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                        *)in_stack_fffffffffffff6f8.__r,
                       (TxStateConfirmed *)in_stack_fffffffffffff6f0);
            SyncTransaction((CWallet *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708)
                            ,(CTransactionRef *)in_stack_fffffffffffff700,
                            (SyncTxState *)in_stack_fffffffffffff6f8.__r,
                            SUB81((ulong)in_stack_fffffffffffff6f0 >> 0x38,0),
                            SUB81((ulong)in_stack_fffffffffffff6f0 >> 0x30,0));
          }
          *(undefined8 *)(in_RDI->last_scanned_block).super_base_blob<256U>.m_data._M_elems =
               local_28;
          *(undefined8 *)((in_RDI->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 8) =
               uStack_20;
          *(undefined8 *)((in_RDI->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 0x10)
               = local_18;
          *(undefined8 *)((in_RDI->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 0x18)
               = uStack_10;
          std::optional<int>::optional<int_&,_true>
                    ((optional<int> *)in_stack_fffffffffffff6f8.__r,(int *)in_stack_fffffffffffff6f0
                    );
          (in_RDI->last_scanned_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int> = local_550;
          if (((in_stack_00000010 & 1) != 0) && (bVar3)) {
            (**(code **)(**(long **)(in_RSI + 0xb8) + 0x30))
                      (local_628,*(long **)(in_RSI + 0xb8),&local_28);
            bVar3 = CBlockLocator::IsNull
                              ((CBlockLocator *)
                               CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
            if (!bVar3) {
              wallet_fmt_01.fmt._4_4_ = in_stack_fffffffffffff76c;
              wallet_fmt_01.fmt._0_4_ = in_stack_fffffffffffff768;
              WalletLogPrintf<int>
                        ((CWallet *)in_stack_fffffffffffff738.lit,wallet_fmt_01,
                         (int *)in_stack_fffffffffffff730);
              GetDatabase((CWallet *)in_stack_fffffffffffff6f8.__r);
              WalletBatch::WalletBatch
                        ((WalletBatch *)in_stack_fffffffffffff6f8.__r,
                         (WalletDatabase *)in_stack_fffffffffffff6f0,
                         SUB41((uint)in_stack_fffffffffffff6ec >> 0x18,0));
              WalletBatch::WriteBestBlock
                        ((WalletBatch *)in_stack_fffffffffffff718,
                         (CBlockLocator *)in_stack_fffffffffffff710);
              WalletBatch::~WalletBatch
                        ((WalletBatch *)
                         CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
            }
            CBlockLocator::~CBlockLocator
                      ((CBlockLocator *)
                       CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
          }
          local_6e4 = 0;
        }
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                   CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        if (local_6e4 == 0) goto LAB_01708382;
      }
      CBlock::~CBlock((CBlock *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      if (local_6e4 != 0) break;
    }
    bVar3 = std::optional::operator_cast_to_bool
                      ((optional<int> *)
                       CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    if (((bVar3) &&
        (in_stack_fffffffffffff76c = local_594._0_4_,
        piVar14 = std::optional<int>::operator*
                            ((optional<int> *)
                             CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)),
        *piVar14 <= in_stack_fffffffffffff76c)) || ((local_60a & 1) == 0)) break;
    local_18 = local_218;
    uStack_10 = uStack_210;
    local_28 = local_228;
    uStack_20 = uStack_220;
    local_594._0_4_ = local_594._0_4_ + 1;
    pCVar10 = chain((CWallet *)in_stack_fffffffffffff6f8.__r);
    (*pCVar10->_vptr_Chain[0x10])(pCVar10,&local_28);
    in_stack_fffffffffffff758.fmt = (char *)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
    local_308 = local_108[2];
    uStack_300 = (undefined4)local_108[3];
    _Stack_2fc = local_108[3]._4_4_;
    local_318 = local_108[0];
    uStack_310 = local_108[1];
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)
               CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    ScanForWalletTransactions::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffff718);
    local_108[0] = local_338;
    local_108[1] = local_330;
    local_108[2] = local_328;
    local_108[3]._0_4_ = local_320;
    local_108[3]._4_4_ = _Stack_31c;
    bVar3 = std::optional::operator_cast_to_bool
                      ((optional<int> *)
                       CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    if ((!bVar3) &&
       (in_stack_fffffffffffff757 =
             ::operator!=((base_blob<256U> *)in_stack_fffffffffffff6f8.__r,
                          (base_blob<256U> *)in_stack_fffffffffffff6f0),
       (bool)in_stack_fffffffffffff757)) {
      pCVar10 = chain((CWallet *)in_stack_fffffffffffff6f8.__r);
      (*pCVar10->_vptr_Chain[0x10])(pCVar10,local_108);
      local_6b0 = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
    }
  }
  bVar3 = std::optional::operator_cast_to_bool
                    ((optional<int> *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8))
  ;
  if (!bVar3) {
    WalletLogPrintf<>((CWallet *)CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),
                      in_stack_fffffffffffff758);
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)
               CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    ScanForWalletTransactions::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)
               CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
  }
  str.lit = (char *)(in_RSI + 0x448);
  ::_(str);
  std::operator+((char *)in_stack_fffffffffffff700,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff6f8.__r);
  GetDisplayName_abi_cxx11_
            ((CWallet *)CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728));
  tinyformat::format<std::__cxx11::string>
            (in_stack_fffffffffffff718,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff710);
  boost::signals2::
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
  ::operator()((signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
                *)in_stack_fffffffffffff6f8.__r,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  bilingual_str::~bilingual_str
            ((bilingual_str *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  if ((local_594._0_4_ == 0) ||
     (bVar3 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff700), !bVar3)
     ) {
    if (local_594._0_4_ != 0) {
      in_stack_fffffffffffff730 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           chain((CWallet *)in_stack_fffffffffffff6f8.__r);
      uVar6 = (**(_func_int **)((long)(in_stack_fffffffffffff730->_M_dataplus)._M_p + 0x120))();
      if ((uVar6 & 1) != 0) {
        wallet_fmt_03.fmt._4_4_ = in_stack_fffffffffffff76c;
        wallet_fmt_03.fmt._0_4_ = in_stack_fffffffffffff768;
        WalletLogPrintf<int,double>
                  ((CWallet *)str.lit,wallet_fmt_03,(int *)in_stack_fffffffffffff730,
                   (double *)CONCAT17((char)uVar6,in_stack_fffffffffffff728));
        in_RDI->status = USER_ABORT;
        goto LAB_0170891d;
      }
    }
    WalletRescanReserver::now((WalletRescanReserver *)in_stack_fffffffffffff6f0);
    std::chrono::operator-
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffff6f0,
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    Ticks<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              (in_stack_fffffffffffff6f8);
    wallet_fmt_04.fmt._4_4_ = in_stack_fffffffffffff76c;
    wallet_fmt_04.fmt._0_4_ = in_stack_fffffffffffff768;
    WalletLogPrintf<long>((CWallet *)str.lit,wallet_fmt_04,(long *)in_stack_fffffffffffff730);
  }
  else {
    wallet_fmt_02.fmt._4_4_ = in_stack_fffffffffffff76c;
    wallet_fmt_02.fmt._0_4_ = in_stack_fffffffffffff768;
    WalletLogPrintf<int,double>
              ((CWallet *)str.lit,wallet_fmt_02,(int *)in_stack_fffffffffffff730,
               (double *)CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728));
    in_RDI->status = USER_ABORT;
  }
LAB_0170891d:
  std::
  unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
  ::~unique_ptr((unique_ptr<wallet::(anonymous_namespace)::FastWalletRescanFilter,_std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>_>
                 *)in_stack_fffffffffffff6f8.__r);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

CWallet::ScanResult CWallet::ScanForWalletTransactions(const uint256& start_block, int start_height, std::optional<int> max_height, const WalletRescanReserver& reserver, bool fUpdate, const bool save_progress)
{
    constexpr auto INTERVAL_TIME{60s};
    auto current_time{reserver.now()};
    auto start_time{reserver.now()};

    assert(reserver.isReserved());

    uint256 block_hash = start_block;
    ScanResult result;

    std::unique_ptr<FastWalletRescanFilter> fast_rescan_filter;
    if (!IsLegacy() && chain().hasBlockFilterIndex(BlockFilterType::BASIC)) fast_rescan_filter = std::make_unique<FastWalletRescanFilter>(*this);

    WalletLogPrintf("Rescan started from block %s... (%s)\n", start_block.ToString(),
                    fast_rescan_filter ? "fast variant using block filters" : "slow variant inspecting all blocks");

    fAbortRescan = false;
    ShowProgress(strprintf("%s " + _("Rescanning…").translated, GetDisplayName()), 0); // show rescan progress in GUI as dialog or on splashscreen, if rescan required on startup (e.g. due to corruption)
    uint256 tip_hash = WITH_LOCK(cs_wallet, return GetLastBlockHash());
    uint256 end_hash = tip_hash;
    if (max_height) chain().findAncestorByHeight(tip_hash, *max_height, FoundBlock().hash(end_hash));
    double progress_begin = chain().guessVerificationProgress(block_hash);
    double progress_end = chain().guessVerificationProgress(end_hash);
    double progress_current = progress_begin;
    int block_height = start_height;
    while (!fAbortRescan && !chain().shutdownRequested()) {
        if (progress_end - progress_begin > 0.0) {
            m_scanning_progress = (progress_current - progress_begin) / (progress_end - progress_begin);
        } else { // avoid divide-by-zero for single block scan range (i.e. start and stop hashes are equal)
            m_scanning_progress = 0;
        }
        if (block_height % 100 == 0 && progress_end - progress_begin > 0.0) {
            ShowProgress(strprintf("%s " + _("Rescanning…").translated, GetDisplayName()), std::max(1, std::min(99, (int)(m_scanning_progress * 100))));
        }

        bool next_interval = reserver.now() >= current_time + INTERVAL_TIME;
        if (next_interval) {
            current_time = reserver.now();
            WalletLogPrintf("Still rescanning. At block %d. Progress=%f\n", block_height, progress_current);
        }

        bool fetch_block{true};
        if (fast_rescan_filter) {
            fast_rescan_filter->UpdateIfNeeded();
            auto matches_block{fast_rescan_filter->MatchesBlock(block_hash)};
            if (matches_block.has_value()) {
                if (*matches_block) {
                    LogDebug(BCLog::SCAN, "Fast rescan: inspect block %d [%s] (filter matched)\n", block_height, block_hash.ToString());
                } else {
                    result.last_scanned_block = block_hash;
                    result.last_scanned_height = block_height;
                    fetch_block = false;
                }
            } else {
                LogDebug(BCLog::SCAN, "Fast rescan: inspect block %d [%s] (WARNING: block filter not found!)\n", block_height, block_hash.ToString());
            }
        }

        // Find next block separately from reading data above, because reading
        // is slow and there might be a reorg while it is read.
        bool block_still_active = false;
        bool next_block = false;
        uint256 next_block_hash;
        chain().findBlock(block_hash, FoundBlock().inActiveChain(block_still_active).nextBlock(FoundBlock().inActiveChain(next_block).hash(next_block_hash)));

        if (fetch_block) {
            // Read block data
            CBlock block;
            chain().findBlock(block_hash, FoundBlock().data(block));

            if (!block.IsNull()) {
                LOCK(cs_wallet);
                if (!block_still_active) {
                    // Abort scan if current block is no longer active, to prevent
                    // marking transactions as coming from the wrong block.
                    result.last_failed_block = block_hash;
                    result.status = ScanResult::FAILURE;
                    break;
                }
                for (size_t posInBlock = 0; posInBlock < block.vtx.size(); ++posInBlock) {
                    SyncTransaction(block.vtx[posInBlock], TxStateConfirmed{block_hash, block_height, static_cast<int>(posInBlock)}, fUpdate, /*rescanning_old_block=*/true);
                }
                // scan succeeded, record block as most recent successfully scanned
                result.last_scanned_block = block_hash;
                result.last_scanned_height = block_height;

                if (save_progress && next_interval) {
                    CBlockLocator loc = m_chain->getActiveChainLocator(block_hash);

                    if (!loc.IsNull()) {
                        WalletLogPrintf("Saving scan progress %d.\n", block_height);
                        WalletBatch batch(GetDatabase());
                        batch.WriteBestBlock(loc);
                    }
                }
            } else {
                // could not scan block, keep scanning but record this block as the most recent failure
                result.last_failed_block = block_hash;
                result.status = ScanResult::FAILURE;
            }
        }
        if (max_height && block_height >= *max_height) {
            break;
        }
        {
            if (!next_block) {
                // break successfully when rescan has reached the tip, or
                // previous block is no longer on the chain due to a reorg
                break;
            }

            // increment block and verification progress
            block_hash = next_block_hash;
            ++block_height;
            progress_current = chain().guessVerificationProgress(block_hash);

            // handle updated tip hash
            const uint256 prev_tip_hash = tip_hash;
            tip_hash = WITH_LOCK(cs_wallet, return GetLastBlockHash());
            if (!max_height && prev_tip_hash != tip_hash) {
                // in case the tip has changed, update progress max
                progress_end = chain().guessVerificationProgress(tip_hash);
            }
        }
    }
    if (!max_height) {
        WalletLogPrintf("Scanning current mempool transactions.\n");
        WITH_LOCK(cs_wallet, chain().requestMempoolTransactions(*this));
    }
    ShowProgress(strprintf("%s " + _("Rescanning…").translated, GetDisplayName()), 100); // hide progress dialog in GUI
    if (block_height && fAbortRescan) {
        WalletLogPrintf("Rescan aborted at block %d. Progress=%f\n", block_height, progress_current);
        result.status = ScanResult::USER_ABORT;
    } else if (block_height && chain().shutdownRequested()) {
        WalletLogPrintf("Rescan interrupted by shutdown request at block %d. Progress=%f\n", block_height, progress_current);
        result.status = ScanResult::USER_ABORT;
    } else {
        WalletLogPrintf("Rescan completed in %15dms\n", Ticks<std::chrono::milliseconds>(reserver.now() - start_time));
    }
    return result;
}